

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateVar
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,Var v,uint32 n)

{
  bool bVar1;
  value_type local_38;
  
  if ((s->assign_).assign_.ebo_.size - 1 < v) {
    while (bVar1 = n != 0, n = n - 1, bVar1) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::remove
                (&this->vars_,(char *)(ulong)v);
      v = v + 1;
    }
  }
  else {
    local_38.super_VsidsScore.value = 0.0;
    local_38.level = 0;
    local_38.factor = 1;
    local_38._12_4_ = 0x3fffffff;
    growVecTo<bk_lib::pod_vector<Clasp::DomScore,std::allocator<Clasp::DomScore>>>
              (&this->score_,n + v,&local_38);
    local_38.super_VsidsScore.value = local_38.super_VsidsScore.value & 0xffffffff00000000;
    growVecTo<bk_lib::pod_vector<int,std::allocator<int>>>
              (&this->occ_,n + v,(value_type_conflict4 *)&local_38);
    while (bVar1 = n != 0, n = n - 1, bVar1) {
      bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::update
                (&this->vars_,(ulong)v);
      v = v + 1;
    }
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateVar(const Solver& s, Var v, uint32 n) {
	if (s.validVar(v)) {
		growVecTo(score_, v+n);
		growVecTo(occ_, v+n);
		for (uint32 end = v+n; v != end; ++v) { vars_.update(v); }
	}
	else {
		for (uint32 end = v+n; v != end; ++v) { vars_.remove(v); }
	}
}